

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCylinderShape.h
# Opt level: O3

void __thiscall cbtCylinderShape::setLocalScaling(cbtCylinderShape *this,cbtVector3 *scaling)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  float in_XMM0_Da;
  float fVar5;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])();
  local_28._4_4_ = in_XMM0_Db;
  local_28._0_4_ = in_XMM0_Da;
  local_28._8_4_ = in_XMM0_Dc;
  local_28._12_4_ = in_XMM0_Dd;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar5 = in_XMM0_Da;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  fVar1 = (this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats[2];
  auVar4 = vinsertps_avx(local_28,ZEXT416((uint)in_XMM0_Da),0x10);
  fVar2 = *(float *)&(this->super_cbtConvexInternalShape).field_0x24;
  uVar3 = *(undefined8 *)(this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats;
  auVar8._0_4_ = auVar4._0_4_ + (float)uVar3;
  auVar8._4_4_ = auVar4._4_4_ + (float)((ulong)uVar3 >> 0x20);
  auVar8._8_4_ = auVar4._8_4_ + 0.0;
  auVar8._12_4_ = auVar4._12_4_ + 0.0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)&(this->super_cbtConvexInternalShape).super_cbtConvexShape.
                            super_cbtCollisionShape.field_0x1c;
  auVar6 = vdivps_avx(auVar8,auVar6);
  cbtConvexInternalShape::setLocalScaling(&this->super_cbtConvexInternalShape,scaling);
  uVar3 = *(undefined8 *)
           &(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
            field_0x1c;
  local_38 = auVar6._0_4_;
  fStack_34 = auVar6._4_4_;
  fStack_30 = auVar6._8_4_;
  fStack_2c = auVar6._12_4_;
  auVar7._0_4_ = (float)uVar3 * local_38;
  auVar7._4_4_ = (float)((ulong)uVar3 >> 0x20) * fStack_34;
  auVar7._8_4_ = fStack_30 * 0.0;
  auVar7._12_4_ = fStack_2c * 0.0;
  auVar6 = vsubps_avx(auVar7,auVar4);
  auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)(((fVar5 + fVar1) / fVar2) *
                                               *(float *)&(this->super_cbtConvexInternalShape).
                                                          field_0x24 - fVar5)),0x28);
  *(undefined1 (*) [16])(this->super_cbtConvexInternalShape).m_implicitShapeDimensions.m_floats =
       auVar6;
  return;
}

Assistant:

virtual void setLocalScaling(const cbtVector3& scaling)
	{
		cbtVector3 oldMargin(getMargin(), getMargin(), getMargin());
		cbtVector3 implicitShapeDimensionsWithMargin = m_implicitShapeDimensions + oldMargin;
		cbtVector3 unScaledImplicitShapeDimensionsWithMargin = implicitShapeDimensionsWithMargin / m_localScaling;

		cbtConvexInternalShape::setLocalScaling(scaling);

		m_implicitShapeDimensions = (unScaledImplicitShapeDimensionsWithMargin * m_localScaling) - oldMargin;
	}